

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::AssertHelper::~AssertHelper(AssertHelper *this)

{
  AssertHelperData *pAVar1;
  pointer pcVar2;
  
  pAVar1 = this->data_;
  if ((pAVar1 != (AssertHelperData *)0x0) &&
     (pcVar2 = (pAVar1->message)._M_dataplus._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar2 != &(pAVar1->message).field_2)) {
    operator_delete(pcVar2);
  }
  operator_delete(pAVar1);
  return;
}

Assistant:

AssertHelper::~AssertHelper() {
  delete data_;
}